

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O2

void __thiscall level_tools::paint_debug_cform(level_tools *this,xr_surface *surface,uint16_t flags)

{
  char *lname;
  bool bVar1;
  
  lname = (surface->m_gamemtl)._M_dataplus._M_p;
  bVar1 = xray_re::xr_ini_file::line_exist(this->m_ini,"debug_cform_textures",lname);
  if (bVar1) {
    xray_re::xr_ini_file::r_string(this->m_ini,"debug_cform_textures",lname);
    std::__cxx11::string::assign((char *)&surface->m_texture);
  }
  else {
    xray_re::msg("can\'t assign texture for game material %s",lname);
  }
  if ((flags & 1) == 0) {
    std::__cxx11::string::assign((char *)&surface->m_eshader);
    return;
  }
  return;
}

Assistant:

void level_tools::paint_debug_cform(xr_surface* surface, uint16_t flags) const
{
	const char* gamemtl = surface->gamemtl().c_str();
	if (m_ini->line_exist("debug_cform_textures", gamemtl))
		surface->texture() = m_ini->r_string("debug_cform_textures", gamemtl);
	else
		msg("can't assign texture for game material %s", gamemtl);
	if ((flags & RSF_COLLISION) == 0)
		surface->eshader() = m_ghost_eshader;
}